

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O3

bool __thiscall cmCTestLaunch::CheckResults(cmCTestLaunch *this)

{
  bool bVar1;
  
  if ((this->Reporter).Passthru != false) {
    return true;
  }
  bVar1 = cmCTestLaunchReporter::IsError(&this->Reporter);
  if ((!bVar1) &&
     ((this->HaveErr != true || (bVar1 = ScrapeLog(this,&(this->Reporter).LogErr), !bVar1)))) {
    if (this->HaveOut != true) {
      return true;
    }
    bVar1 = ScrapeLog(this,&(this->Reporter).LogOut);
    if (!bVar1) {
      return true;
    }
  }
  return false;
}

Assistant:

bool cmCTestLaunch::CheckResults()
{
  // Skip XML in passthru mode.
  if (this->Reporter.Passthru) {
    return true;
  }

  // We always report failure for error conditions.
  if (this->Reporter.IsError()) {
    return false;
  }

  // Scrape the output logs to look for warnings.
  if ((this->HaveErr && this->ScrapeLog(this->Reporter.LogErr)) ||
      (this->HaveOut && this->ScrapeLog(this->Reporter.LogOut))) {
    return false;
  }
  return true;
}